

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

shared_ptr<httplib::Response> __thiscall
httplib::Client::Delete(Client *this,char *path,Headers *headers)

{
  size_type sVar1;
  char cVar2;
  socket_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<httplib::Response> sVar4;
  Request req;
  Request local_1a0;
  
  local_1a0.version._M_dataplus._M_p = (pointer)&local_1a0.version.field_2;
  local_1a0.version._M_string_length = 0;
  local_1a0.version.field_2._M_local_buf[0] = '\0';
  local_1a0.method._M_dataplus._M_p = (pointer)&local_1a0.method.field_2;
  local_1a0.method._M_string_length = 0;
  local_1a0.method.field_2._M_local_buf[0] = '\0';
  local_1a0.target._M_dataplus._M_p = (pointer)&local_1a0.target.field_2;
  local_1a0.target._M_string_length = 0;
  local_1a0.target.field_2._M_local_buf[0] = '\0';
  local_1a0.path._M_dataplus._M_p = (pointer)&local_1a0.path.field_2;
  local_1a0.path._M_string_length = 0;
  local_1a0.path.field_2._M_local_buf[0] = '\0';
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.body._M_dataplus._M_p = (pointer)&local_1a0.body.field_2;
  local_1a0.body._M_string_length = 0;
  local_1a0.body.field_2._M_local_buf[0] = '\0';
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0.progress._M_invoker = (_Invoker_type)0x0;
  local_1a0.progress.super__Function_base._M_functor._8_8_ = 0;
  local_1a0.progress.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1a0.matches._M_begin._M_current = (char *)0x0;
  local_1a0.progress.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.matches.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_replace((ulong)&local_1a0.method,0,(char *)0x0,0x15c509);
  sVar1 = local_1a0.path._M_string_length;
  strlen((char *)headers);
  std::__cxx11::string::_M_replace((ulong)&local_1a0.path,0,(char *)sVar1,(ulong)headers);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_1a0.headers._M_t,in_RCX);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa8);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016f488;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)(this_00 + 2);
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(undefined1 *)&this_00[2]._vptr__Sp_counted_base = 0;
  *(undefined4 *)&this_00[3]._vptr__Sp_counted_base = 0xffffffff;
  *(undefined4 *)&this_00[4]._vptr__Sp_counted_base = 0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)(this_00 + 4);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_00[5]._M_use_count = this_00 + 4;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&this_00[6]._M_use_count = &this_00[7]._M_use_count;
  this_00[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&this_00[7]._M_use_count = 0;
  this_00[8]._M_use_count = 0;
  this_00[8]._M_weak_count = 0;
  this_00[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[9]._M_use_count = 0;
  this_00[9]._M_weak_count = 0;
  this_00[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  if ((char *)local_1a0.path._M_string_length != (char *)0x0) {
    sVar3 = detail::
            create_socket<httplib::Client::create_client_socket()const::_lambda(int,addrinfo&)_1_>
                      (*(char **)(path + 8),*(int *)(path + 0x28),(anon_class_8_1_8991fb9c)path,0);
    if (sVar3 != -1) {
      cVar2 = (**(code **)(*(long *)path + 0x18))(path,sVar3,&local_1a0,this_00 + 1);
      if (cVar2 != '\0') {
        this->_vptr_Client = (_func_int **)(this_00 + 1);
        (this->host_)._M_dataplus._M_p = (pointer)this_00;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        goto LAB_001422fb;
      }
    }
  }
  this->_vptr_Client = (_func_int **)0x0;
  (this->host_)._M_dataplus._M_p = (pointer)0x0;
LAB_001422fb:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  Request::~Request(&local_1a0);
  sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<httplib::Response>)
         sVar4.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Delete(const char* path, const Headers& headers)
{
    Request req;
    req.method = "DELETE";
    req.path = path;
    req.headers = headers;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}